

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GLMClassifier::InternalSwap(GLMClassifier *this,GLMClassifier *other)

{
  GLMClassifier *other_local;
  GLMClassifier *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->weights_).super_RepeatedPtrFieldBase,
             &(other->weights_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->offset_,&other->offset_);
  std::swap<int>(&this->postevaluationtransform_,&other->postevaluationtransform_);
  std::swap<int>(&this->classencoding_,&other->classencoding_);
  std::swap<CoreML::Specification::GLMClassifier::ClassLabelsUnion>
            (&this->ClassLabels_,&other->ClassLabels_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void GLMClassifier::InternalSwap(GLMClassifier* other) {
  weights_.InternalSwap(&other->weights_);
  offset_.InternalSwap(&other->offset_);
  std::swap(postevaluationtransform_, other->postevaluationtransform_);
  std::swap(classencoding_, other->classencoding_);
  std::swap(ClassLabels_, other->ClassLabels_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}